

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# enter.hpp
# Opt level: O2

number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
* __thiscall
soplex::
SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
::test(number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
       *__return_storage_ptr__,
      SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
      *this,int i,Status stat)

{
  type_conflict5 tVar1;
  cpp_dec_float<50U,_int,_void> *v;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *result_1;
  cpp_dec_float<50U,_int,_void> *u;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  result;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_a8;
  cpp_dec_float<50U,_int,_void> local_68;
  
  local_a8.m_backend.fpclass = cpp_dec_float_finite;
  local_a8.m_backend.prec_elem = 10;
  local_a8.m_backend.data._M_elems[0] = 0;
  local_a8.m_backend.data._M_elems[1] = 0;
  local_a8.m_backend.data._M_elems[2] = 0;
  local_a8.m_backend.data._M_elems[3] = 0;
  local_a8.m_backend.data._M_elems[4] = 0;
  local_a8.m_backend.data._M_elems[5] = 0;
  local_a8.m_backend.data._M_elems._24_5_ = 0;
  local_a8.m_backend.data._M_elems[7]._1_3_ = 0;
  local_a8.m_backend.data._M_elems._32_5_ = 0;
  local_a8.m_backend.data._M_elems[9]._1_3_ = 0;
  local_a8.m_backend.exp = 0;
  local_a8.m_backend.neg = false;
  switch(stat) {
  case D_FREE:
  case D_ON_BOTH:
    local_68.fpclass = cpp_dec_float_finite;
    local_68.prec_elem = 10;
    local_68.data._M_elems[0] = 0;
    local_68.data._M_elems[1] = 0;
    local_68.data._M_elems[2] = 0;
    local_68.data._M_elems[3] = 0;
    local_68.data._M_elems[4] = 0;
    local_68.data._M_elems[5] = 0;
    local_68.data._M_elems._24_5_ = 0;
    local_68.data._M_elems[7]._1_3_ = 0;
    local_68.data._M_elems._32_5_ = 0;
    local_68.data._M_elems[9]._1_3_ = 0;
    local_68.exp = 0;
    local_68.neg = false;
    boost::multiprecision::default_ops::
    eval_subtract_default<boost::multiprecision::backends::cpp_dec_float<50u,int,void>>
              (&local_68,
               &(this->thePvec->
                super_VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                ).val.
                super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                ._M_impl.super__Vector_impl_data._M_start[i].m_backend,
               &(this->
                super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                ).
                super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                .left.val.
                super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                ._M_impl.super__Vector_impl_data._M_start[i].m_backend);
    local_a8.m_backend.data._M_elems._32_5_ = local_68.data._M_elems._32_5_;
    local_a8.m_backend.data._M_elems[9]._1_3_ = local_68.data._M_elems[9]._1_3_;
    local_a8.m_backend.data._M_elems[4] = local_68.data._M_elems[4];
    local_a8.m_backend.data._M_elems[5] = local_68.data._M_elems[5];
    local_a8.m_backend.data._M_elems._24_5_ = local_68.data._M_elems._24_5_;
    local_a8.m_backend.data._M_elems[7]._1_3_ = local_68.data._M_elems[7]._1_3_;
    local_a8.m_backend.data._M_elems[0] = local_68.data._M_elems[0];
    local_a8.m_backend.data._M_elems[1] = local_68.data._M_elems[1];
    local_a8.m_backend.data._M_elems[2] = local_68.data._M_elems[2];
    local_a8.m_backend.data._M_elems[3] = local_68.data._M_elems[3];
    local_a8.m_backend.exp = local_68.exp;
    local_a8.m_backend.neg = local_68.neg;
    local_a8.m_backend.fpclass = local_68.fpclass;
    local_a8.m_backend.prec_elem = local_68.prec_elem;
    local_68.data._M_elems._0_8_ = local_68.data._M_elems._0_8_ & 0xffffffff00000000;
    tVar1 = boost::multiprecision::operator<(&local_a8,(int *)&local_68);
    if (tVar1) {
      *(ulong *)((__return_storage_ptr__->m_backend).data._M_elems + 8) =
           CONCAT35(local_a8.m_backend.data._M_elems[9]._1_3_,
                    local_a8.m_backend.data._M_elems._32_5_);
      *(undefined8 *)((__return_storage_ptr__->m_backend).data._M_elems + 4) =
           local_a8.m_backend.data._M_elems._16_8_;
      *(ulong *)((__return_storage_ptr__->m_backend).data._M_elems + 6) =
           CONCAT35(local_a8.m_backend.data._M_elems[7]._1_3_,
                    local_a8.m_backend.data._M_elems._24_5_);
      *(undefined8 *)(__return_storage_ptr__->m_backend).data._M_elems =
           local_a8.m_backend.data._M_elems._0_8_;
      *(undefined8 *)((__return_storage_ptr__->m_backend).data._M_elems + 2) =
           local_a8.m_backend.data._M_elems._8_8_;
      (__return_storage_ptr__->m_backend).exp = local_a8.m_backend.exp;
      (__return_storage_ptr__->m_backend).neg = local_a8.m_backend.neg;
      (__return_storage_ptr__->m_backend).fpclass = local_a8.m_backend.fpclass;
      (__return_storage_ptr__->m_backend).prec_elem = local_a8.m_backend.prec_elem;
      return __return_storage_ptr__;
    }
    goto LAB_002394a1;
  case D_ON_UPPER:
    u = &(this->thePvec->
         super_VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
         ).val.
         super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
         ._M_impl.super__Vector_impl_data._M_start[i].m_backend;
    v = &(this->
         super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
         ).
         super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
         .left.val.
         super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
         ._M_impl.super__Vector_impl_data._M_start[i].m_backend;
    break;
  case D_ON_LOWER:
LAB_002394a1:
    u = &(this->
         super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
         ).
         super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
         .right.val.
         super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
         ._M_impl.super__Vector_impl_data._M_start[i].m_backend;
    v = &(this->thePvec->
         super_VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
         ).val.
         super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
         ._M_impl.super__Vector_impl_data._M_start[i].m_backend;
    (__return_storage_ptr__->m_backend).fpclass = cpp_dec_float_finite;
    (__return_storage_ptr__->m_backend).prec_elem = 10;
    goto LAB_002394c0;
  case P_ON_LOWER:
    u = &(this->thePvec->
         super_VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
         ).val.
         super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
         ._M_impl.super__Vector_impl_data._M_start[i].m_backend;
    v = &(this->
         super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
         ).
         super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
         .object.val.
         super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
         ._M_impl.super__Vector_impl_data._M_start[i].m_backend;
    break;
  default:
    boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::cpp_dec_float<long_long>
              (&__return_storage_ptr__->m_backend,0,(type *)0x0);
    return __return_storage_ptr__;
  case P_ON_UPPER:
    u = &(this->
         super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
         ).
         super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
         .object.val.
         super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
         ._M_impl.super__Vector_impl_data._M_start[i].m_backend;
    v = &(this->thePvec->
         super_VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
         ).val.
         super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
         ._M_impl.super__Vector_impl_data._M_start[i].m_backend;
    break;
  case P_FREE:
    local_68.fpclass = cpp_dec_float_finite;
    local_68.prec_elem = 10;
    local_68.data._M_elems[0] = 0;
    local_68.data._M_elems[1] = 0;
    local_68.data._M_elems[2] = 0;
    local_68.data._M_elems[3] = 0;
    local_68.data._M_elems[4] = 0;
    local_68.data._M_elems[5] = 0;
    local_68.data._M_elems._24_5_ = 0;
    local_68.data._M_elems[7]._1_3_ = 0;
    local_68.data._M_elems._32_5_ = 0;
    local_68.data._M_elems[9]._1_3_ = 0;
    local_68.exp = 0;
    local_68.neg = false;
    boost::multiprecision::default_ops::
    eval_subtract_default<boost::multiprecision::backends::cpp_dec_float<50u,int,void>>
              (&local_68,
               &(this->
                super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                ).
                super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                .object.val.
                super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                ._M_impl.super__Vector_impl_data._M_start[i].m_backend,
               &(this->thePvec->
                super_VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                ).val.
                super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                ._M_impl.super__Vector_impl_data._M_start[i].m_backend);
    local_a8.m_backend.data._M_elems._32_5_ = local_68.data._M_elems._32_5_;
    local_a8.m_backend.data._M_elems[9]._1_3_ = local_68.data._M_elems[9]._1_3_;
    local_a8.m_backend.data._M_elems[4] = local_68.data._M_elems[4];
    local_a8.m_backend.data._M_elems[5] = local_68.data._M_elems[5];
    local_a8.m_backend.data._M_elems._24_5_ = local_68.data._M_elems._24_5_;
    local_a8.m_backend.data._M_elems[7]._1_3_ = local_68.data._M_elems[7]._1_3_;
    local_a8.m_backend.data._M_elems[0] = local_68.data._M_elems[0];
    local_a8.m_backend.data._M_elems[1] = local_68.data._M_elems[1];
    local_a8.m_backend.data._M_elems[2] = local_68.data._M_elems[2];
    local_a8.m_backend.data._M_elems[3] = local_68.data._M_elems[3];
    local_a8.m_backend.exp = local_68.exp;
    local_a8.m_backend.neg = local_68.neg;
    local_a8.m_backend.fpclass = local_68.fpclass;
    local_a8.m_backend.prec_elem = local_68.prec_elem;
    local_68.data._M_elems._0_8_ = local_68.data._M_elems._0_8_ & 0xffffffff00000000;
    tVar1 = boost::multiprecision::operator<(&local_a8,(int *)&local_68);
    *(undefined8 *)(__return_storage_ptr__->m_backend).data._M_elems =
         local_a8.m_backend.data._M_elems._0_8_;
    *(undefined8 *)((__return_storage_ptr__->m_backend).data._M_elems + 2) =
         local_a8.m_backend.data._M_elems._8_8_;
    *(undefined8 *)((__return_storage_ptr__->m_backend).data._M_elems + 4) =
         local_a8.m_backend.data._M_elems._16_8_;
    *(ulong *)((__return_storage_ptr__->m_backend).data._M_elems + 6) =
         CONCAT35(local_a8.m_backend.data._M_elems[7]._1_3_,local_a8.m_backend.data._M_elems._24_5_)
    ;
    *(ulong *)((__return_storage_ptr__->m_backend).data._M_elems + 8) =
         CONCAT35(local_a8.m_backend.data._M_elems[9]._1_3_,local_a8.m_backend.data._M_elems._32_5_)
    ;
    (__return_storage_ptr__->m_backend).exp = local_a8.m_backend.exp;
    (__return_storage_ptr__->m_backend).neg = local_a8.m_backend.neg;
    (__return_storage_ptr__->m_backend).fpclass = local_a8.m_backend.fpclass;
    (__return_storage_ptr__->m_backend).prec_elem = local_a8.m_backend.prec_elem;
    if (tVar1) {
      return __return_storage_ptr__;
    }
    boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::negate
              (&__return_storage_ptr__->m_backend);
    return __return_storage_ptr__;
  }
  (__return_storage_ptr__->m_backend).fpclass = cpp_dec_float_finite;
  (__return_storage_ptr__->m_backend).prec_elem = 10;
LAB_002394c0:
  (__return_storage_ptr__->m_backend).data._M_elems[0] = 0;
  (__return_storage_ptr__->m_backend).data._M_elems[1] = 0;
  (__return_storage_ptr__->m_backend).data._M_elems[2] = 0;
  (__return_storage_ptr__->m_backend).data._M_elems[3] = 0;
  (__return_storage_ptr__->m_backend).data._M_elems[4] = 0;
  (__return_storage_ptr__->m_backend).data._M_elems[5] = 0;
  (__return_storage_ptr__->m_backend).data._M_elems[6] = 0;
  (__return_storage_ptr__->m_backend).data._M_elems[7] = 0;
  *(undefined8 *)((long)(__return_storage_ptr__->m_backend).data._M_elems + 0x1d) = 0;
  *(undefined8 *)((long)(__return_storage_ptr__->m_backend).data._M_elems + 0x25) = 0;
  boost::multiprecision::default_ops::
  eval_subtract_default<boost::multiprecision::backends::cpp_dec_float<50u,int,void>>
            (&__return_storage_ptr__->m_backend,u,v);
  return __return_storage_ptr__;
}

Assistant:

R SPxSolverBase<R>::test(int i, typename SPxBasisBase<R>::Desc::Status stat) const
{
   assert(type() == ENTER);
   assert(!isBasic(stat));

   R x;

   switch(stat)
   {
   case SPxBasisBase<R>::Desc::D_FREE:
   case SPxBasisBase<R>::Desc::D_ON_BOTH:
      assert(rep() == ROW);
      x = (*thePvec)[i] - this->lhs(i);

      if(x < 0)
         return x;

   // no break: next is else case
   //lint -fallthrough
   case SPxBasisBase<R>::Desc::D_ON_LOWER:
      assert(rep() == ROW);
      return this->rhs(i) - (*thePvec)[i];

   case SPxBasisBase<R>::Desc::D_ON_UPPER:
      assert(rep() == ROW);
      return (*thePvec)[i] - this->lhs(i);

   case SPxBasisBase<R>::Desc::P_ON_UPPER:
      assert(rep() == COLUMN);
      return this->maxObj(i) - (*thePvec)[i];

   case SPxBasisBase<R>::Desc::P_ON_LOWER:
      assert(rep() == COLUMN);
      return (*thePvec)[i] - this->maxObj(i);

   case SPxBasisBase<R>::Desc::P_FREE :
      x = this->maxObj(i) - (*thePvec)[i];
      return (x < 0) ? x : -x;

   default:
      return 0;
   }
}